

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall MPLSParser::composePlayListMark(MPLSParser *this,BitStreamWriter *writer)

{
  pointer pPVar1;
  uint value;
  int iVar2;
  uint32_t uVar3;
  MPLSStreamInfo *streamInfo;
  int iVar4;
  int iVar5;
  uint *puVar6;
  int iVar7;
  uint32_t *puVar8;
  pointer pPVar9;
  uint local_70 [2];
  uint *local_68;
  uint *local_60;
  ulong local_58;
  uint *local_50;
  ulong local_48;
  uint *local_40;
  int local_34;
  
  local_40 = (writer->super_BitStream).m_buffer;
  puVar6 = (writer->super_BitStream).m_initBuffer;
  local_48 = (ulong)writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x20,0);
  local_50 = (writer->super_BitStream).m_buffer;
  local_60 = (writer->super_BitStream).m_initBuffer;
  local_58 = (ulong)writer->m_bitWrited;
  streamInfo = getMainStream(this);
  if ((this->m_marks).super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_marks).super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (this->m_chapterLen == 0) {
      local_34 = -1;
      std::vector<PlayListMark,std::allocator<PlayListMark>>::emplace_back<int,unsigned_int&>
                ((vector<PlayListMark,std::allocator<PlayListMark>> *)&this->m_marks,&local_34,
                 &this->IN_time);
    }
    else {
      local_70[0] = this->IN_time;
      local_68 = puVar6;
      if (local_70[0] < this->OUT_time) {
        do {
          local_70[1] = 0xffffffff;
          std::vector<PlayListMark,std::allocator<PlayListMark>>::emplace_back<int,unsigned_int&>
                    ((vector<PlayListMark,std::allocator<PlayListMark>> *)&this->m_marks,
                     (int *)(local_70 + 1),local_70);
          local_70[0] = this->m_chapterLen * 45000 + local_70[0];
          puVar6 = local_68;
        } while (local_70[0] < this->OUT_time);
      }
    }
  }
  BitStreamWriter::putBits
            (writer,0x10,
             (uint)((ulong)((long)(this->m_marks).
                                  super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_marks).
                                 super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3));
  pPVar9 = (this->m_marks).super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (this->m_marks).super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar9 != pPVar1) {
    puVar8 = &pPVar9->m_markTime;
    do {
      BitStreamWriter::putBits(writer,8,0);
      BitStreamWriter::putBits(writer,8,1);
      value = ((PlayListMark *)(puVar8 + -1))->m_playItemID;
      if ((int)value < 0) {
        value = calcPlayItemID(streamInfo,*puVar8 * 2);
      }
      BitStreamWriter::putBits(writer,0x10,value);
      BitStreamWriter::putBits(writer,0x20,*puVar8);
      BitStreamWriter::putBits(writer,0x10,0xffff);
      BitStreamWriter::putBits(writer,0x20,0);
      pPVar9 = (pointer)(puVar8 + 1);
      puVar8 = puVar8 + 2;
    } while (pPVar9 != pPVar1);
  }
  iVar5 = (int)local_50 - (int)local_60;
  iVar2 = (int)local_58 + iVar5 * 8;
  iVar7 = (int)local_40 - (int)puVar6;
  iVar4 = (int)local_48 + iVar7 * 8;
  iVar5 = (int)local_58 + iVar5 * 8 + 7;
  if (-1 < iVar2) {
    iVar5 = iVar2;
  }
  iVar2 = (int)local_48 + iVar7 * 8 + 7;
  if (-1 < iVar4) {
    iVar2 = iVar4;
  }
  iVar7 = *(int *)&(writer->super_BitStream).m_buffer -
          *(int *)&(writer->super_BitStream).m_initBuffer;
  iVar4 = writer->m_bitWrited + iVar7 * 8;
  iVar7 = writer->m_bitWrited + iVar7 * 8 + 7;
  if (-1 < iVar4) {
    iVar7 = iVar4;
  }
  uVar3 = my_ntohl((iVar7 >> 3) - (iVar5 >> 3));
  *(uint32_t *)((long)puVar6 + (long)(iVar2 >> 3)) = uVar3;
  return;
}

Assistant:

void MPLSParser::composePlayListMark(BitStreamWriter& writer)
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;
    const MPLSStreamInfo& streamInfo = getMainStream();
    if (m_marks.empty())
    {
        if (m_chapterLen == 0)
            m_marks.emplace_back(-1, IN_time);
        else
        {
            for (uint32_t i = IN_time; i < OUT_time; i += m_chapterLen * 45000) m_marks.emplace_back(-1, i);
        }
    }
    writer.putBits(16, static_cast<unsigned>(m_marks.size()));
    for (const auto& i : m_marks)
    {
        writer.putBits(8, 0);  // reserved_for_future_use
        writer.putBits(8, 1);  // mark_type 0x01 = Chapter search
        if (i.m_playItemID >= 0)
            writer.putBits(16, i.m_playItemID);  // play item ID
        else
            writer.putBits(16, calcPlayItemID(streamInfo, i.m_markTime * 2));  // play item ID
        writer.putBits(32, i.m_markTime);
        writer.putBits(16, 0xffff);  // entry_ES_PID always 0xffff for mark_type 1
        writer.putBits(32, 0);       // duration always 0 for mark_type 1
    }
    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}